

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_vhost_unbind_wsi(lws *wsi)

{
  lws *wsi_local;
  
  if (wsi->vhost != (lws_vhost *)0x0) {
    if (wsi->vhost->count_bound_wsi < 1) {
      __assert_fail("wsi->vhost->count_bound_wsi > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi.c"
                    ,0x46,"void lws_vhost_unbind_wsi(struct lws *)");
    }
    wsi->vhost->count_bound_wsi = wsi->vhost->count_bound_wsi + -1;
    _lws_log(0x10,"%s: vh %s: count_bound_wsi %d\n","lws_vhost_unbind_wsi",wsi->vhost->name,
             (ulong)(uint)wsi->vhost->count_bound_wsi);
    if ((wsi->vhost->count_bound_wsi == 0) && (((byte)wsi->vhost->field_0x2b4 >> 2 & 1) != 0)) {
      __lws_vhost_destroy2(wsi->vhost);
    }
    wsi->vhost = (lws_vhost *)0x0;
  }
  return;
}

Assistant:

void
lws_vhost_unbind_wsi(struct lws *wsi)
{
	if (!wsi->vhost)
		return;

	lws_context_lock(wsi->context, __func__); /* ---------- context { */

	assert(wsi->vhost->count_bound_wsi > 0);
	wsi->vhost->count_bound_wsi--;
	lwsl_debug("%s: vh %s: count_bound_wsi %d\n", __func__,
		   wsi->vhost->name, wsi->vhost->count_bound_wsi);

	if (!wsi->vhost->count_bound_wsi &&
	    wsi->vhost->being_destroyed) {
		/*
		 * We have closed all wsi that were bound to this vhost
		 * by any pt: nothing can be servicing any wsi belonging
		 * to it any more.
		 *
		 * Finalize the vh destruction
		 */
		__lws_vhost_destroy2(wsi->vhost);
	}
	wsi->vhost = NULL;

	lws_context_unlock(wsi->context); /* } context ---------- */
}